

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModulationType.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::ModulationType::Encode(ModulationType *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  ModulationType *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,(this->field_0).m_ui16SpreadSpectrum);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16MajorModulationType);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Detail);
  KDataStream::operator<<(pKVar1,this->m_ui16System);
  return;
}

Assistant:

void ModulationType::Encode( KDataStream & stream ) const
{
    stream << m_ui16SpreadSpectrum
           << m_ui16MajorModulationType
           << m_ui16Detail
           << m_ui16System;
}